

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareProgram
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          programInfo *out_program_info)

{
  string *out_source_code;
  _Alloc_hider vertex_shader_code_00;
  _Alloc_hider geometry_shader_code_00;
  _Alloc_hider fragment_shader_code_00;
  _Alloc_hider compute_shader_code_00;
  char *pcVar1;
  _Alloc_hider tesselation_control_shader_code;
  _Alloc_hider tesselation_evaluation_shader_code;
  char *out_variable_definitions;
  char *stage_specific_layout;
  string tess_eval_shader_code;
  string tess_ctrl_shader_code;
  string fragment_shader_code;
  string uniform_verification;
  string uniform_definitions;
  string vertex_shader_code;
  string geometry_shader_code;
  string compute_shader_code;
  
  out_source_code = &tess_eval_shader_code;
  compute_shader_code._M_dataplus._M_p = (pointer)&compute_shader_code.field_2;
  compute_shader_code._M_string_length = 0;
  compute_shader_code.field_2._M_local_buf[0] = '\0';
  fragment_shader_code._M_dataplus._M_p = (pointer)&fragment_shader_code.field_2;
  fragment_shader_code._M_string_length = 0;
  fragment_shader_code.field_2._M_local_buf[0] = '\0';
  geometry_shader_code._M_dataplus._M_p = (pointer)&geometry_shader_code.field_2;
  geometry_shader_code._M_string_length = 0;
  geometry_shader_code.field_2._M_local_buf[0] = '\0';
  tess_ctrl_shader_code._M_dataplus._M_p = (pointer)&tess_ctrl_shader_code.field_2;
  tess_ctrl_shader_code._M_string_length = 0;
  tess_ctrl_shader_code.field_2._M_local_buf[0] = '\0';
  tess_eval_shader_code._M_dataplus._M_p = (pointer)&tess_eval_shader_code.field_2;
  tess_eval_shader_code._M_string_length = 0;
  tess_eval_shader_code.field_2._M_local_buf[0] = '\0';
  vertex_shader_code._M_string_length = 0;
  vertex_shader_code.field_2._M_local_buf[0] = '\0';
  uniform_definitions._M_string_length = 0;
  uniform_definitions.field_2._M_local_buf[0] = '\0';
  uniform_verification._M_string_length = 0;
  uniform_verification.field_2._M_local_buf[0] = '\0';
  uniform_verification._M_dataplus._M_p = (pointer)&uniform_verification.field_2;
  uniform_definitions._M_dataplus._M_p = (pointer)&uniform_definitions.field_2;
  vertex_shader_code._M_dataplus._M_p = (pointer)&vertex_shader_code.field_2;
  prepareUniformDefinitions(this,shader_stage,uniform_type,&uniform_definitions);
  prepareUniformVerification(this,shader_stage,uniform_type,&uniform_verification);
  switch(shader_stage) {
  case COMPUTE_SHADER:
    prepareTestComputeShader
              (this,uniform_definitions._M_dataplus._M_p,uniform_verification._M_dataplus._M_p,
               &compute_shader_code);
    goto switchD_00921527_default;
  case FRAGMENT_SHADER:
    stage_specific_layout = glcts::fixed_sample_locations_values + 1;
    prepareBoilerplateShader
              (this,glcts::fixed_sample_locations_values + 1,
               "    if (0 == gl_VertexID)\n    {\n        gl_Position = vec4(-1, -1, 0, 1);\n    }\n    else if (1 == gl_VertexID)\n    {\n        gl_Position = vec4(-1, 1, 0, 1);\n    }\n    else if (2 == gl_VertexID)\n    {\n        gl_Position = vec4(1, 1, 0, 1);\n    }\n    else if (3 == gl_VertexID)\n    {\n        gl_Position = vec4(1, -1, 0, 1);\n    }\n"
               ,&vertex_shader_code);
    out_source_code = &fragment_shader_code;
    pcVar1 = "\n    result = verification_result;\n";
    out_variable_definitions = "layout(location = 0) out int result;\n";
    goto LAB_009216bf;
  case GEOMETRY_SHADER:
  case TESS_CTRL_SHADER:
  case TESS_EVAL_SHADER:
    prepareBoilerplateShader
              (this,glcts::fixed_sample_locations_values + 1,"    gl_Position = vec4(1, 0, 0, 1);\n"
               ,&vertex_shader_code);
    pcVar1 = (char *)this;
    break;
  case VERTEX_SHADER:
    pcVar1 = "\n    result = verification_result;\n";
    prepareTestShader((GPUShaderFP64Test2 *)"\n    result = verification_result;\n",
                      glcts::fixed_sample_locations_values + 1,uniform_definitions._M_dataplus._M_p,
                      glcts::fixed_sample_locations_values + 1,"out int result;\n",
                      uniform_verification._M_dataplus._M_p,"\n    result = verification_result;\n",
                      &vertex_shader_code);
    break;
  default:
    goto switchD_00921527_default;
  }
  prepareBoilerplateShader
            ((GPUShaderFP64Test2 *)pcVar1,glcts::fixed_sample_locations_values + 1,"    discard;\n",
             &fragment_shader_code);
  out_variable_definitions = "out int result;\n";
  if (shader_stage == GEOMETRY_SHADER) {
    out_source_code = &geometry_shader_code;
    pcVar1 = "\n    result = verification_result;\n\n    EmitVertex();\n    EndPrimitive();\n";
    stage_specific_layout =
         "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n";
  }
  else {
    if (shader_stage == TESS_CTRL_SHADER) {
      prepareTestShader((GPUShaderFP64Test2 *)
                        "\n    tcs_tes_result[gl_InvocationID] = verification_result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n"
                        ,"layout(vertices = 1) out;\n\n",uniform_definitions._M_dataplus._M_p,
                        glcts::fixed_sample_locations_values + 1,"out int tcs_tes_result[];\n",
                        uniform_verification._M_dataplus._M_p,
                        "\n    tcs_tes_result[gl_InvocationID] = verification_result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n"
                        ,&tess_ctrl_shader_code);
      prepareTestShader((GPUShaderFP64Test2 *)"    result = tcs_tes_result[0];\n",
                        "layout(isolines, point_mode) in;\n\n",
                        glcts::fixed_sample_locations_values + 1,"in  int tcs_tes_result[];\n",
                        "out int result;\n",glcts::fixed_sample_locations_values + 1,
                        "    result = tcs_tes_result[0];\n",&tess_eval_shader_code);
      goto switchD_00921527_default;
    }
    if (shader_stage != TESS_EVAL_SHADER) goto switchD_00921527_default;
    prepareBoilerplateShader
              ((GPUShaderFP64Test2 *)pcVar1,"layout(vertices = 1) out;\n\n",
               "    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n"
               ,&tess_ctrl_shader_code);
    pcVar1 = "\n    result = verification_result;\n";
    stage_specific_layout = "layout(isolines, point_mode) in;\n\n";
  }
LAB_009216bf:
  prepareTestShader((GPUShaderFP64Test2 *)pcVar1,stage_specific_layout,
                    uniform_definitions._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                    out_variable_definitions,uniform_verification._M_dataplus._M_p,pcVar1,
                    out_source_code);
switchD_00921527_default:
  compute_shader_code_00._M_p = (pointer)compute_shader_code._M_string_length;
  if (compute_shader_code._M_string_length != 0) {
    compute_shader_code_00._M_p = compute_shader_code._M_dataplus._M_p;
  }
  fragment_shader_code_00._M_p = (pointer)fragment_shader_code._M_string_length;
  if (fragment_shader_code._M_string_length != 0) {
    fragment_shader_code_00._M_p = fragment_shader_code._M_dataplus._M_p;
  }
  geometry_shader_code_00._M_p = (pointer)geometry_shader_code._M_string_length;
  if (geometry_shader_code._M_string_length != 0) {
    geometry_shader_code_00._M_p = geometry_shader_code._M_dataplus._M_p;
  }
  tesselation_control_shader_code._M_p = (pointer)tess_ctrl_shader_code._M_string_length;
  if (tess_ctrl_shader_code._M_string_length != 0) {
    tesselation_control_shader_code._M_p = tess_ctrl_shader_code._M_dataplus._M_p;
  }
  tesselation_evaluation_shader_code._M_p = (pointer)tess_eval_shader_code._M_string_length;
  if (tess_eval_shader_code._M_string_length != 0) {
    tesselation_evaluation_shader_code._M_p = tess_eval_shader_code._M_dataplus._M_p;
  }
  vertex_shader_code_00._M_p = (pointer)vertex_shader_code._M_string_length;
  if (vertex_shader_code._M_string_length != 0) {
    vertex_shader_code_00._M_p = vertex_shader_code._M_dataplus._M_p;
  }
  Utils::programInfo::build
            (out_program_info,compute_shader_code_00._M_p,fragment_shader_code_00._M_p,
             geometry_shader_code_00._M_p,tesselation_control_shader_code._M_p,
             tesselation_evaluation_shader_code._M_p,vertex_shader_code_00._M_p,
             &prepareProgram::varying_name,(uint)(FRAGMENT_SHADER < shader_stage));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uniform_verification._M_dataplus._M_p != &uniform_verification.field_2) {
    operator_delete(uniform_verification._M_dataplus._M_p,
                    CONCAT71(uniform_verification.field_2._M_allocated_capacity._1_7_,
                             uniform_verification.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uniform_definitions._M_dataplus._M_p != &uniform_definitions.field_2) {
    operator_delete(uniform_definitions._M_dataplus._M_p,
                    CONCAT71(uniform_definitions.field_2._M_allocated_capacity._1_7_,
                             uniform_definitions.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertex_shader_code._M_dataplus._M_p != &vertex_shader_code.field_2) {
    operator_delete(vertex_shader_code._M_dataplus._M_p,
                    CONCAT71(vertex_shader_code.field_2._M_allocated_capacity._1_7_,
                             vertex_shader_code.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tess_eval_shader_code._M_dataplus._M_p != &tess_eval_shader_code.field_2) {
    operator_delete(tess_eval_shader_code._M_dataplus._M_p,
                    CONCAT71(tess_eval_shader_code.field_2._M_allocated_capacity._1_7_,
                             tess_eval_shader_code.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tess_ctrl_shader_code._M_dataplus._M_p != &tess_ctrl_shader_code.field_2) {
    operator_delete(tess_ctrl_shader_code._M_dataplus._M_p,
                    CONCAT71(tess_ctrl_shader_code.field_2._M_allocated_capacity._1_7_,
                             tess_ctrl_shader_code.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)geometry_shader_code._M_dataplus._M_p != &geometry_shader_code.field_2) {
    operator_delete(geometry_shader_code._M_dataplus._M_p,
                    CONCAT71(geometry_shader_code.field_2._M_allocated_capacity._1_7_,
                             geometry_shader_code.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fragment_shader_code._M_dataplus._M_p != &fragment_shader_code.field_2) {
    operator_delete(fragment_shader_code._M_dataplus._M_p,
                    CONCAT71(fragment_shader_code.field_2._M_allocated_capacity._1_7_,
                             fragment_shader_code.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compute_shader_code._M_dataplus._M_p != &compute_shader_code.field_2) {
    operator_delete(compute_shader_code._M_dataplus._M_p,
                    CONCAT71(compute_shader_code.field_2._M_allocated_capacity._1_7_,
                             compute_shader_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareProgram(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
										Utils::programInfo& out_program_info) const
{
	/* Stage specific layouts */
	static const glw::GLchar* geometry_shader_layout_code = "layout(points)                   in;\n"
															"layout(points, max_vertices = 1) out;\n"
															"\n";

	static const glw::GLchar* tess_ctrl_shader_layout_code = "layout(vertices = 1) out;\n"
															 "\n";

	static const glw::GLchar* tess_eval_shader_layout_code = "layout(isolines, point_mode) in;\n"
															 "\n";

	/* Stage specific main body */
	static const glw::GLchar* boilerplate_fragment_shader_body_code = "    discard;\n";

	static const glw::GLchar* boilerplate_tess_ctrl_shader_body_code = "    gl_TessLevelOuter[0] = 1.0;\n"
																	   "    gl_TessLevelOuter[1] = 1.0;\n"
																	   "    gl_TessLevelOuter[2] = 1.0;\n"
																	   "    gl_TessLevelOuter[3] = 1.0;\n"
																	   "    gl_TessLevelInner[0] = 1.0;\n"
																	   "    gl_TessLevelInner[1] = 1.0;\n";

	static const glw::GLchar* boilerplate_vertex_shader_body_code = "    gl_Position = vec4(1, 0, 0, 1);\n";

	static const glw::GLchar* corner_vertex_shader_body_code = "    if (0 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(-1, -1, 0, 1);\n"
															   "    }\n"
															   "    else if (1 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(-1, 1, 0, 1);\n"
															   "    }\n"
															   "    else if (2 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(1, 1, 0, 1);\n"
															   "    }\n"
															   "    else if (3 == gl_VertexID)\n"
															   "    {\n"
															   "        gl_Position = vec4(1, -1, 0, 1);\n"
															   "    }\n";

	static const glw::GLchar* passthrough_tess_eval_shader_body_code = "    result = tcs_tes_result[0];\n";

	static const glw::GLchar* test_shader_body_code = "\n    result = verification_result;\n";

	static const glw::GLchar* test_geometry_shader_body_code = "\n    result = verification_result;\n"
															   "\n"
															   "    EmitVertex();\n"
															   "    EndPrimitive();\n";

	static const glw::GLchar* test_tess_ctrl_shader_body_code =
		"\n    tcs_tes_result[gl_InvocationID] = verification_result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n";

	/* In variables */
	static const glw::GLchar* test_tess_ctrl_shader_in_variable = "in  int tcs_tes_result[];\n";

	/* Out variables */
	static const glw::GLchar* test_fragment_shader_out_variable = "layout(location = 0) out int result;\n";

	static const glw::GLchar* test_tess_ctrl_shader_out_variable = "out int tcs_tes_result[];\n";

	static const glw::GLchar* test_shader_out_variable = "out int result;\n";

	/* Varying name */
	static const glw::GLchar* varying_name = "result";
	glw::GLuint				  n_varyings   = 1;

	/* Storage for ready shaders */
	std::string compute_shader_code;
	std::string fragment_shader_code;
	std::string geometry_shader_code;
	std::string tess_ctrl_shader_code;
	std::string tess_eval_shader_code;
	std::string vertex_shader_code;

	/* Storage for uniform definition and verification code */
	std::string uniform_definitions;
	std::string uniform_verification;

	/* Get uniform definition and verification code */
	prepareUniformDefinitions(shader_stage, uniform_type, uniform_definitions);
	prepareUniformVerification(shader_stage, uniform_type, uniform_verification);

	/* Prepare vertex shader */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		prepareBoilerplateShader("", corner_vertex_shader_body_code, vertex_shader_code);

		break;

	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:

		prepareBoilerplateShader("", boilerplate_vertex_shader_body_code, vertex_shader_code);

		break;

	case VERTEX_SHADER:

		prepareTestShader("" /* layout */, uniform_definitions.c_str() /* uniforms */, "" /* in var */,
						  test_shader_out_variable /* out var */, uniform_verification.c_str() /* verification */,
						  test_shader_body_code /* body */, vertex_shader_code);

		break;

	default:
		break;
	}

	/* Prepare fragment shader */
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:

		prepareTestShader("" /* layout */, uniform_definitions.c_str() /* uniforms */, "" /* in var */,
						  test_fragment_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_shader_body_code /* body */,
						  fragment_shader_code);

		break;

	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		prepareBoilerplateShader("" /* layout */, boilerplate_fragment_shader_body_code /* body */,
								 fragment_shader_code);

		break;

	default:
		break;
	}

	/* Prepare compute, tess_ctrl, tess_eval, geometry shaders */
	switch (shader_stage)
	{
	case COMPUTE_SHADER:

		prepareTestComputeShader(uniform_definitions.c_str(), uniform_verification.c_str(), compute_shader_code);

		break;

	case GEOMETRY_SHADER:

		prepareTestShader(geometry_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_geometry_shader_body_code /* body */,
						  geometry_shader_code);

		break;

	case TESS_CTRL_SHADER:

		prepareTestShader(tess_ctrl_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_tess_ctrl_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_tess_ctrl_shader_body_code /* body */,
						  tess_ctrl_shader_code);

		prepareTestShader(tess_eval_shader_layout_code /* layout */, "" /* uniforms */,
						  test_tess_ctrl_shader_in_variable /* in var */, test_shader_out_variable /* out var */,
						  "" /* verification */, passthrough_tess_eval_shader_body_code /* body */,
						  tess_eval_shader_code);

		break;

	case TESS_EVAL_SHADER:

		prepareBoilerplateShader(tess_ctrl_shader_layout_code /* layout */,
								 boilerplate_tess_ctrl_shader_body_code /* body */, tess_ctrl_shader_code);

		prepareTestShader(tess_eval_shader_layout_code /* layout */, uniform_definitions.c_str() /* uniforms */,
						  "" /* in var */, test_shader_out_variable /* out var */,
						  uniform_verification.c_str() /* verification */, test_shader_body_code /* body */,
						  tess_eval_shader_code);

		break;

	default:
		break;
	};

	/* Select shaders that will be used by program */
	const glw::GLchar* cs_c_str  = 0;
	const glw::GLchar* fs_c_str  = 0;
	const glw::GLchar* gs_c_str  = 0;
	const glw::GLchar* tcs_c_str = 0;
	const glw::GLchar* tes_c_str = 0;
	const glw::GLchar* vs_c_str  = 0;

	if (false == compute_shader_code.empty())
	{
		cs_c_str = compute_shader_code.c_str();
	}

	if (false == fragment_shader_code.empty())
	{
		fs_c_str = fragment_shader_code.c_str();
	}

	if (false == geometry_shader_code.empty())
	{
		gs_c_str = geometry_shader_code.c_str();
	}

	if (false == tess_ctrl_shader_code.empty())
	{
		tcs_c_str = tess_ctrl_shader_code.c_str();
	}

	if (false == tess_eval_shader_code.empty())
	{
		tes_c_str = tess_eval_shader_code.c_str();
	}

	if (false == vertex_shader_code.empty())
	{
		vs_c_str = vertex_shader_code.c_str();
	}

	/* Compute and fragment shader results are stored in texture, do not set varyings for transfrom feedback */
	if ((COMPUTE_SHADER == shader_stage) || (FRAGMENT_SHADER == shader_stage))
	{
		n_varyings = 0;
	}

	/* Build */
	out_program_info.build(cs_c_str, fs_c_str, gs_c_str, tcs_c_str, tes_c_str, vs_c_str, &varying_name, n_varyings);
}